

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

uint __thiscall IRBuilder::AddStatementBoundary(IRBuilder *this,uint statementIndex,uint offset)

{
  bool bVar1;
  BOOL BVar2;
  uint byteCodeOffset;
  uint32 uVar3;
  Func *this_00;
  JITTimeFunctionBody *pJVar4;
  FunctionBody *this_01;
  uint32 local_28;
  uint32 local_24;
  LONG col;
  ULONG line;
  PragmaInstr *pragmaInstr;
  uint offset_local;
  uint statementIndex_local;
  IRBuilder *this_local;
  
  pragmaInstr._0_4_ = offset;
  pragmaInstr._4_4_ = statementIndex;
  _offset_local = this;
  if ((statementIndex != 0xffffffff) || (bVar1 = Func::IsJitInDebugMode(this->m_func), !bVar1)) {
    _col = IR::PragmaInstr::New(StatementBoundary,pragmaInstr._4_4_,this->m_func);
    AddInstr(this,&_col->super_Instr,(uint)pragmaInstr);
  }
  bVar1 = Func::IsOOPJIT(this->m_func);
  if (!bVar1) {
    this_00 = Func::GetTopFunc(this->m_func);
    BVar2 = Func::HasTry(this_00);
    if ((BVar2 == 0) && (pragmaInstr._4_4_ != 0xffffffff)) {
      bVar1 = Js::ConfigFlagsTable::IsEnabled
                        ((ConfigFlagsTable *)&Js::Configuration::Global,BailOutFlag);
      if (bVar1) {
        pJVar4 = Func::GetJITFunctionBody(this->m_func);
        bVar1 = JITTimeFunctionBody::IsLibraryCode(pJVar4);
        if (!bVar1) {
          pJVar4 = Func::GetJITFunctionBody(this->m_func);
          this_01 = (FunctionBody *)JITTimeFunctionBody::GetAddr(pJVar4);
          byteCodeOffset = Js::ByteCodeReader::GetCurrentOffset(&this->m_jnReader);
          bVar1 = Js::FunctionBody::GetLineCharOffset
                            (this_01,byteCodeOffset,&local_24,(LONG *)&local_28,false);
          if (bVar1) {
            local_24 = local_24 + 1;
            bVar1 = Js::NumberPairSet::Contains((NumberPairSet *)&DAT_01e9e278,local_24,local_28);
            if ((bVar1) ||
               (bVar1 = Js::NumberPairSet::Contains
                                  ((NumberPairSet *)&DAT_01e9e278,local_24,0xffffffff), bVar1)) {
              InjectBailOut(this,(uint)pragmaInstr);
            }
          }
          goto LAB_00634f2a;
        }
      }
      bVar1 = Js::ConfigFlagsTable::IsEnabled
                        ((ConfigFlagsTable *)&Js::Configuration::Global,BailOutAtEveryLineFlag);
      if (bVar1) {
        InjectBailOut(this,(uint)pragmaInstr);
      }
    }
  }
LAB_00634f2a:
  uVar3 = Js::
          StatementReader<JsUtil::List<Js::FunctionBody::StatementMap_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>_>
          ::MoveNextStatementBoundary(&this->m_statementReader);
  return uVar3;
}

Assistant:

uint
IRBuilder::AddStatementBoundary(uint statementIndex, uint offset)
{
    // Under debugger we use full stmt map, so that we know exactly start and end of each user stmt.
    // We insert additional instrs in between statements, such as ProfiledLoopStart, for these bytecode reader acts as
    // there is "unknown" stmt boundary with statementIndex == -1. Don't add stmt boundary for that as later
    // it may cause issues, e.g. see WinBlue 218307.
    if (!(statementIndex == Js::Constants::NoStatementIndex && this->m_func->IsJitInDebugMode()))
    {
        IR::PragmaInstr* pragmaInstr = IR::PragmaInstr::New(Js::OpCode::StatementBoundary, statementIndex, m_func);
        this->AddInstr(pragmaInstr, offset);
    }

#ifdef BAILOUT_INJECTION
    if (!this->m_func->IsOOPJIT())
    {
        // Don't inject bailout if the function have trys
        if (!this->m_func->GetTopFunc()->HasTry() && (statementIndex != Js::Constants::NoStatementIndex))
        {
            if (Js::Configuration::Global.flags.IsEnabled(Js::BailOutFlag) && !this->m_func->GetJITFunctionBody()->IsLibraryCode())
            {
                ULONG line;
                LONG col;

                // Since we're on a separate thread, don't allow the line cache to be allocated in the Recycler.
                if (((Js::FunctionBody*)m_func->GetJITFunctionBody()->GetAddr())->GetLineCharOffset(this->m_jnReader.GetCurrentOffset(), &line, &col, false /*canAllocateLineCache*/))
                {
                    line++;
                    if (Js::Configuration::Global.flags.BailOut.Contains(line, (uint32)col) || Js::Configuration::Global.flags.BailOut.Contains(line, (uint32)-1))
                    {
                        this->InjectBailOut(offset);
                    }
                }
            }
            else if (Js::Configuration::Global.flags.IsEnabled(Js::BailOutAtEveryLineFlag)) 
            {
                this->InjectBailOut(offset);
            }
        }
    }
#endif
    return m_statementReader.MoveNextStatementBoundary();
}